

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_tests.cpp
# Opt level: O0

void __thiscall
test::syntax_tests::iu_SyntaxTest_x_iutest_x_ExceptionThrow_Test::Body
          (iu_SyntaxTest_x_iutest_x_ExceptionThrow_Test *this)

{
  bool bVar1;
  Fixed *fixed;
  bad_exception *anon_var_0_3;
  char *msg_3;
  int x_3;
  bad_exception *anon_var_0_2;
  char *msg_2;
  int x_2;
  bad_exception *anon_var_0_1;
  char *msg_1;
  undefined1 local_1f0 [4];
  int x_1;
  Fixed local_1c0;
  bad_exception *anon_var_0;
  char *local_20;
  char *msg;
  iu_SyntaxTest_x_iutest_x_ExceptionThrow_Test *piStack_10;
  int x;
  iu_SyntaxTest_x_iutest_x_ExceptionThrow_Test *this_local;
  
  msg._4_4_ = 2;
  piStack_10 = this;
  iutest::detail::AlwaysZero();
  local_20 = "";
  bVar1 = iutest::detail::AlwaysTrue();
  if (bVar1) {
    ExceptionFunction(msg._4_4_);
  }
  local_20 = 
  "\nExpected: ExceptionFunction(x) throws an exception of type ::std::bad_exception.\n  Actual: it throws nothing."
  ;
  memset(&local_1c0,0,0x188);
  iutest::AssertionHelper::Fixed::Fixed(&local_1c0);
  fixed = iutest::AssertionHelper::Fixed::operator<<(&local_1c0,msg._4_4_);
  iutest::AssertionHelper::AssertionHelper
            ((AssertionHelper *)local_1f0,
             "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_tests.cpp"
             ,0x34e,local_20,kFatalFailure);
  iutest::AssertionHelper::operator=((AssertionHelper *)local_1f0,fixed);
  iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)local_1f0);
  iutest::AssertionHelper::Fixed::~Fixed(&local_1c0);
  return;
}

Assistant:

IUTEST(SyntaxTest, ExceptionThrow)
{
    if( int x = 2 )
        IUTEST_ASSERT_THROW(ExceptionFunction(x), ::std::bad_exception) << x;
    if( int x = 2 )
        IUTEST_EXPECT_THROW(ExceptionFunction(x), ::std::bad_exception) << x;
    if( int x = 2 )
        IUTEST_INFORM_THROW(ExceptionFunction(x), ::std::bad_exception) << x;
    if( int x = 2 )
        IUTEST_ASSUME_THROW(ExceptionFunction(x), ::std::bad_exception) << x;
}